

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_array_global.cpp
# Opt level: O2

void __thiscall
optimization::func_array_global::Func_Array_Global::optimize_func
          (Func_Array_Global *this,MirFunction *func,MirPackage *mir)

{
  string *__lhs;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  Inst *pIVar3;
  byte bVar4;
  MirPackage *this_01;
  pointer puVar5;
  Displayable DVar6;
  pointer puVar7;
  size_t sVar8;
  bool bVar9;
  int iVar10;
  size_type sVar11;
  _Rb_tree_node_base *p_Var12;
  _Rb_tree_node_base *p_Var13;
  MirFunction *pMVar14;
  mapped_type *pmVar15;
  mapped_type *pmVar16;
  reference pvVar17;
  mapped_type *pmVar18;
  long *plVar19;
  long lVar20;
  ostream *poVar21;
  undefined4 extraout_var;
  iterator __position;
  undefined4 extraout_var_00;
  _Base_ptr p_Var22;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_3;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *__args;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *__args_00;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *this_02;
  _Alloc_hider _Var23;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_1;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  _Base_ptr p_Var24;
  allocator<char> local_3ea;
  allocator<char> local_3e9;
  MirPackage *local_3e8;
  MirFunction *local_3e0;
  _Rb_tree_node_base *local_3d8;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range2;
  _Base_ptr local_3c8;
  GlobalVarManager gvm;
  string local_3b8;
  VarId ref_var;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  init_insts;
  mapped_type def_point;
  VarId var_3;
  VarId var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338 [3];
  bool local_300;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  call_insts;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *__range2_1;
  VarId init_var;
  bool local_2a8;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> ref_results;
  Timestamp local_270;
  undefined **local_258;
  uint32_t local_250;
  undefined **local_248;
  uint32_t local_240;
  undefined **local_238;
  uint32_t local_230;
  undefined **local_228;
  uint32_t local_220;
  VarId local_218;
  string name;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> vars;
  map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
  local_1b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> val;
  string local_168;
  string local_148;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_128;
  Variable local_110;
  Variable local_f0;
  undefined1 local_d0 [56];
  Var_Replace vp;
  
  if ((func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    __lhs = &func->name;
    bVar9 = std::operator==(__lhs,"$$5_main");
    if (!bVar9) {
      p_Var22 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_3e8 = mir;
      local_3e0 = func;
      var_replace::Var_Replace::Var_Replace(&vp,func);
      ref_results._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &ref_results._M_t._M_impl.super__Rb_tree_header._M_header;
      ref_results._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      ref_results._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      ref_results._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      __range2 = (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)&p_Var22[3]._M_parent;
      p_Var2 = p_Var22[3]._M_left;
      local_3c8 = p_Var22;
      ref_results._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           ref_results._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (p_Var24 = p_Var22[3]._M_parent; p_Var24 != p_Var2;
          p_Var24 = (_Base_ptr)&p_Var24->_M_parent) {
        iVar10 = (**(code **)(**(long **)p_Var24 + 8))();
        if (iVar10 == 2) {
          (**(code **)(**(long **)p_Var24 + 0x10))(&vars._M_t);
          sVar8 = vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::~_Rb_tree(&vars._M_t);
          if (sVar8 != 0) {
            std::
            _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
            ::_M_insert_unique<mir::inst::VarId_const&>
                      ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                        *)&ref_results,(VarId *)(*(long *)p_Var24 + 8));
          }
        }
      }
      p_Var24 = local_3c8[3]._M_left;
      p_Var1 = &vars._M_t._M_impl.super__Rb_tree_header;
      for (p_Var22 = local_3c8[3]._M_parent; p_Var22 != p_Var24;
          p_Var22 = (_Base_ptr)&p_Var22->_M_parent) {
        iVar10 = (**(code **)(**(long **)p_Var22 + 8))();
        if (iVar10 == 4) {
          (**(code **)(**(long **)p_Var22 + 0x10))(&vars);
          p_Var12 = vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if (1 < vars._M_t._M_impl.super__Rb_tree_header._M_node_count) {
            for (; (_Rb_tree_header *)p_Var12 != p_Var1;
                p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
              var.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
              var.id = *(uint32_t *)&p_Var12[1]._M_parent;
              sVar11 = std::
                       set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                       ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                *)&ref_results._M_t,&var);
              if (sVar11 != 0) {
                std::
                _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::erase(&ref_results._M_t,&var);
              }
            }
          }
LAB_0014641b:
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::~_Rb_tree(&vars._M_t);
        }
        else {
          iVar10 = (**(code **)(**(long **)p_Var22 + 8))();
          if ((iVar10 == 6) &&
             (bVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(*(long *)p_Var22 + 0x18),"memset"), !bVar9)) {
            (**(code **)(**(long **)p_Var22 + 0x10))(&vars);
            p_Var12 = vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if (1 < vars._M_t._M_impl.super__Rb_tree_header._M_node_count) {
              for (; (_Rb_tree_header *)p_Var12 != p_Var1;
                  p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
                var.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
                var.id = *(uint32_t *)&p_Var12[1]._M_parent;
                sVar11 = std::
                         set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                         ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                  *)&ref_results._M_t,&var);
                if (sVar11 != 0) {
                  std::
                  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  ::erase(&ref_results._M_t,&var);
                }
              }
            }
            goto LAB_0014641b;
          }
        }
      }
      local_3d8 = &(local_3e0->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header;
      for (p_Var12 = (local_3e0->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var12 != local_3d8; p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
        if (p_Var12[1]._M_color != *(_Rb_tree_color *)&local_3c8[1]._M_left) {
          p_Var24 = p_Var12[3]._M_left;
          for (p_Var22 = p_Var12[3]._M_parent; p_Var22 != p_Var24;
              p_Var22 = (_Base_ptr)&p_Var22->_M_parent) {
            iVar10 = (**(code **)(**(long **)p_Var22 + 8))();
            p_Var13 = ref_results._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if ((iVar10 == 4) ||
               (iVar10 = (**(code **)(**(long **)p_Var22 + 8))(),
               p_Var13 = ref_results._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               iVar10 == 6)) {
              for (; (_Rb_tree_header *)p_Var13 != &ref_results._M_t._M_impl.super__Rb_tree_header;
                  p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
                var.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
                var.id = *(uint32_t *)&p_Var13[1]._M_parent;
                (**(code **)(**(long **)p_Var22 + 0x10))(&vars._M_t);
                sVar11 = std::
                         set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                         ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                  *)&vars._M_t,&var);
                std::
                _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::~_Rb_tree(&vars._M_t);
                if (sVar11 != 0) {
                  std::
                  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  ::erase(&ref_results._M_t,&var);
                  break;
                }
              }
            }
          }
        }
      }
      if (ref_results._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        gvm.mir = local_3e8;
        init_insts.
        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        init_insts.
        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        init_insts.
        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        call_insts.
        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        call_insts.
        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        call_insts.
        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pMVar14 = GlobalVarManager::get_init_func(&gvm);
        p_Var22 = (pMVar14->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_3e8 = (MirPackage *)&p_Var22[3]._M_parent;
        p_Var24 = p_Var22[3]._M_left;
        bVar4 = 0;
        for (p_Var22 = p_Var22[3]._M_parent; p_Var22 != p_Var24;
            p_Var22 = (_Base_ptr)&p_Var22->_M_parent) {
          iVar10 = (**(code **)(**(long **)p_Var22 + 8))();
          this_02 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                     *)&call_insts;
          if (!(bool)(bVar4 | iVar10 == 6)) {
            this_02 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                       *)&init_insts;
          }
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    (this_02,(unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             p_Var22);
          bVar4 = bVar4 | iVar10 == 6;
        }
        std::
        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ::clear((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 *)local_3e8);
        this_00 = &local_3e0->variables;
        p_Var22 = ref_results._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while (puVar5 = init_insts.
                        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish, this_01 = local_3e8,
              __args = init_insts.
                       super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
              (_Rb_tree_header *)p_Var22 != &ref_results._M_t._M_impl.super__Rb_tree_header) {
          var_3.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
          var_3.id = *(uint32_t *)&p_Var22[1]._M_parent;
          var_replace::Var_Replace::Var_Replace((Var_Replace *)&vars,local_3e0);
          local_3d8 = p_Var22;
          pmVar15 = std::
                    map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                    ::at(&local_1b0,(key_type *)&var_3);
          def_point = *pmVar15;
          pmVar16 = std::
                    map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    ::at(&func->basic_blks,&def_point.first);
          pvVar17 = std::
                    vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ::at(&pmVar16->inst,(long)def_point.second);
          (*(((pvVar17->_M_t).
              super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
              super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
              super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
            _vptr_Displayable[2])((Function *)&var);
          ref_var.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
          ref_var.id = *(uint32_t *)(local_338[0]._M_allocated_capacity + 0x28);
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                       *)&var);
          pmVar18 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::at(this_00,&ref_var.id);
          iVar10 = ::mir::inst::Variable::size(pmVar18);
          var.super_Displayable._vptr_Displayable =
               var.super_Displayable._vptr_Displayable & 0xffffffff00000000;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&val,(long)(iVar10 / 4),(value_type *)&var,(allocator_type *)&init_var);
          std::__cxx11::string::string((string *)&local_148,(string *)__lhs);
          local_218.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
          local_218.id = ref_var.id;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_128,&val);
          arm::ConstValue::ConstValue
                    ((ConstValue *)local_d0,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_128,
                     (optional<int>)0x0);
          GlobalVarManager::add_global_var(&name,&gvm,&local_148,&local_218,(ConstValue *)local_d0);
          std::__detail::__variant::
          _Variant_storage<false,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~_Variant_storage((_Variant_storage<false,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)(local_d0 + 8));
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_128);
          std::__cxx11::string::~string((string *)&local_148);
          if ((*(long *)(std::__cxx11::stringstream::stringstream + *(long *)(std::clog + -0x18)) ==
               0) || (plVar19 = (long *)__dynamic_cast(*(long *)(std::__cxx11::stringstream::
                                                                 stringstream +
                                                                *(long *)(std::clog + -0x18)),
                                                       &std::streambuf::typeinfo,
                                                       &AixLog::Log::typeinfo,0),
                     plVar19 == (long *)0x0)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&var,"Trace",(allocator<char> *)&init_var);
            std::operator<<((ostream *)&std::clog,(string *)&var);
            std::__cxx11::string::~string((string *)&var);
          }
          else {
            std::recursive_mutex::lock
                      ((recursive_mutex *)&((pthread_mutex_t *)(plVar19 + 0x29))->__data);
            if ((char)plVar19[0x10] != '\0') {
              (**(code **)(*plVar19 + 0x30))(plVar19);
              *(undefined1 *)(plVar19 + 0x10) = 0;
              plVar19[0x23] = 0;
              *(undefined1 *)(plVar19 + 0x24) = 1;
              AixLog::Tag::Tag((Tag *)&var,(nullptr_t)0x0);
              AixLog::Tag::operator=((Tag *)(plVar19 + 0x11),(Tag *)&var);
              AixLog::Tag::~Tag((Tag *)&var);
              AixLog::Function::Function((Function *)&var,(nullptr_t)0x0);
              AixLog::Function::operator=((Function *)(plVar19 + 0x17),(Function *)&var);
              AixLog::Function::~Function((Function *)&var);
              *(undefined1 *)(plVar19 + 0x25) = 1;
            }
            pthread_mutex_unlock((pthread_mutex_t *)(plVar19 + 0x29));
          }
          AixLog::Tag::Tag((Tag *)&init_var);
          if ((*(long *)(std::__cxx11::stringstream::stringstream + *(long *)(std::clog + -0x18)) ==
               0) || (lVar20 = __dynamic_cast(*(long *)(std::__cxx11::stringstream::stringstream +
                                                       *(long *)(std::clog + -0x18)),
                                              &std::streambuf::typeinfo,&AixLog::Log::typeinfo,0),
                     lVar20 == 0)) {
            if (local_2a8 == false) {
              std::operator<<((ostream *)&std::clog,(string *)&init_var.id);
            }
          }
          else {
            std::recursive_mutex::lock
                      ((recursive_mutex *)&((pthread_mutex_t *)(lVar20 + 0x148))->__data);
            AixLog::Tag::operator=((Tag *)(lVar20 + 0x88),(Tag *)&init_var);
            pthread_mutex_unlock((pthread_mutex_t *)(lVar20 + 0x148));
          }
          local_270.time_point.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          local_270._vptr_Timestamp = (_func_int **)&PTR__Timestamp_001d8f28;
          local_270.is_null_ = false;
          if ((*(long *)(std::__cxx11::stringstream::stringstream + *(long *)(std::clog + -0x18)) ==
               0) || (lVar20 = __dynamic_cast(*(long *)(std::__cxx11::stringstream::stringstream +
                                                       *(long *)(std::clog + -0x18)),
                                              &std::streambuf::typeinfo,&AixLog::Log::typeinfo,0),
                     lVar20 == 0)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3b8,"%Y-%m-%d %H-%M-%S.#ms",(allocator<char> *)&local_168);
            AixLog::Timestamp::to_string((string *)&var,&local_270,&local_3b8);
            std::operator<<((ostream *)&std::clog,(string *)&var);
            std::__cxx11::string::~string((string *)&var);
            std::__cxx11::string::~string((string *)&local_3b8);
          }
          else {
            std::recursive_mutex::lock
                      ((recursive_mutex *)&((pthread_mutex_t *)(lVar20 + 0x148))->__data);
            *(bool *)(lVar20 + 0x120) = local_270.is_null_;
            ((duration *)(lVar20 + 0x118))->__r = (rep)local_270.time_point.__d.__r;
            pthread_mutex_unlock((pthread_mutex_t *)(lVar20 + 0x148));
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3b8,"optimize_func",&local_3e9);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_168,
                     "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/func_array_global.cpp"
                     ,&local_3ea);
          AixLog::Function::Function((Function *)&var,&local_3b8,&local_168,0x82);
          if ((*(long *)(std::__cxx11::stringstream::stringstream + *(long *)(std::clog + -0x18)) ==
               0) || (lVar20 = __dynamic_cast(*(long *)(std::__cxx11::stringstream::stringstream +
                                                       *(long *)(std::clog + -0x18)),
                                              &std::streambuf::typeinfo,&AixLog::Log::typeinfo,0),
                     lVar20 == 0)) {
            if (local_300 == false) {
              std::operator<<((ostream *)&std::clog,(string *)&var.id);
            }
          }
          else {
            std::recursive_mutex::lock
                      ((recursive_mutex *)&((pthread_mutex_t *)(lVar20 + 0x148))->__data);
            AixLog::Function::operator=((Function *)(lVar20 + 0xb8),(Function *)&var);
            pthread_mutex_unlock((pthread_mutex_t *)(lVar20 + 0x148));
          }
          poVar21 = std::operator<<((ostream *)&std::clog,"convert array ");
          (**ref_var.super_Displayable._vptr_Displayable)(&ref_var,poVar21);
          poVar21 = std::operator<<(poVar21,"in ");
          poVar21 = std::operator<<(poVar21,(string *)__lhs);
          poVar21 = std::operator<<(poVar21," to global array ");
          poVar21 = std::operator<<(poVar21,(string *)&name);
          poVar21 = std::operator<<(poVar21,"");
          std::endl<char,std::char_traits<char>>(poVar21);
          AixLog::Function::~Function((Function *)&var);
          std::__cxx11::string::~string((string *)&local_168);
          std::__cxx11::string::~string((string *)&local_3b8);
          AixLog::Tag::~Tag((Tag *)&init_var);
          std::make_unique<mir::inst::RefInst,mir::inst::VarId&,std::__cxx11::string&>
                    (&var,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &var_3);
          DVar6 = var.super_Displayable;
          var.super_Displayable._vptr_Displayable = (_func_int **)0x0;
          pIVar3 = (pvVar17->_M_t).
                   super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                   super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
          (pvVar17->_M_t).
          super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
          super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
               (Inst *)DVar6._vptr_Displayable;
          if (pIVar3 != (Inst *)0x0) {
            (*(pIVar3->super_Displayable)._vptr_Displayable[5])();
          }
          std::unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>::~unique_ptr
                    ((unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                     &var);
          pmVar18 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::at(this_00,&var_3.id);
          ::mir::inst::Variable::Variable(&local_f0,pmVar18);
          GlobalVarManager::get_new_init_id((GlobalVarManager *)&init_var,(Variable *)&gvm);
          ::mir::inst::Variable::~Variable(&local_f0);
          std::make_unique<mir::inst::RefInst,mir::inst::VarId&,std::__cxx11::string&>
                    ((VarId *)&local_3b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&init_var)
          ;
          var.super_Displayable._vptr_Displayable = (_func_int **)local_3b8._M_dataplus._M_p;
          local_3b8._M_dataplus._M_p = (pointer)0x0;
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                      *)&init_insts,
                     (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)&var);
          if (var.super_Displayable._vptr_Displayable != (_func_int **)0x0) {
            (**(code **)(*var.super_Displayable._vptr_Displayable + 0x28))();
          }
          var.super_Displayable._vptr_Displayable = (_func_int **)0x0;
          std::unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>::~unique_ptr
                    ((unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                     &local_3b8);
          var.super_Displayable._vptr_Displayable._0_4_ = ref_var.id;
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
          ::erase(&this_00->_M_t,(key_type_conflict *)&var);
          __position._M_current =
               (__range2->
               super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
          while ((_Base_ptr)__position._M_current != local_3c8[3]._M_left) {
            (*((((__position._M_current)->_M_t).
                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
              _vptr_Displayable[2])((Function *)&var);
            sVar11 = std::
                     set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                     ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                              *)&var,(key_type *)&var_3);
            if (sVar11 != 0) {
              iVar10 = (*((((__position._M_current)->_M_t).
                           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                         super_Displayable)._vptr_Displayable[1])();
              std::
              _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                           *)&var);
              if (iVar10 != 4) goto LAB_00146d54;
              iVar10 = (*((((__position._M_current)->_M_t).
                           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                         super_Displayable)._vptr_Displayable[6])();
              var.super_Displayable._vptr_Displayable = (_func_int **)CONCAT44(extraout_var,iVar10);
              local_228 = &PTR_display_001d90d0;
              local_220 = var_3.id;
              local_238 = &PTR_display_001d90d0;
              local_230 = init_var.id;
              (**(code **)(*var.super_Displayable._vptr_Displayable + 0x18))
                        (var.super_Displayable._vptr_Displayable,&local_228,&local_238);
              std::
              vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                        ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                          *)&init_insts,
                         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)&var)
              ;
              __position = std::
                           vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           ::erase(__range2,(const_iterator)__position._M_current);
              _Var23._M_p = (pointer)var.super_Displayable;
              goto LAB_00146e7b;
            }
            std::
            _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
            ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                         *)&var);
LAB_00146d54:
            (*((((__position._M_current)->_M_t).
                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
              _vptr_Displayable[2])((Function *)&var);
            sVar11 = std::
                     set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                     ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                              *)&var,(key_type *)&var_3);
            if (sVar11 == 0) {
              std::
              _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                           *)&var);
LAB_00146e97:
              __position._M_current = __position._M_current + 1;
            }
            else {
              iVar10 = (*((((__position._M_current)->_M_t).
                           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                         super_Displayable)._vptr_Displayable[1])();
              std::
              _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                           *)&var);
              if (iVar10 != 6) goto LAB_00146e97;
              bVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(((__position._M_current)->_M_t).
                                          super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                          _M_head_impl + 1),"memset");
              if (bVar9) {
                iVar10 = (*((((__position._M_current)->_M_t).
                             super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                             .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                           super_Displayable)._vptr_Displayable[6])();
                local_3b8._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_00,iVar10);
                local_248 = &PTR_display_001d90d0;
                local_240 = var_3.id;
                local_258 = &PTR_display_001d90d0;
                local_250 = init_var.id;
                (**(code **)(*(_func_int **)local_3b8._M_dataplus._M_p + 0x18))
                          (local_3b8._M_dataplus._M_p,&local_248,&local_258);
                pmVar18 = std::
                          map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                          ::at(this_00,&((((__position._M_current)->_M_t).
                                          super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                         _M_head_impl)->dest).id);
                ::mir::inst::Variable::Variable(&local_110,pmVar18);
                GlobalVarManager::get_new_init_id((GlobalVarManager *)&var,(Variable *)&gvm);
                *(uint32_t *)(local_3b8._M_dataplus._M_p + 0x10) = var.id;
                ::mir::inst::Variable::~Variable(&local_110);
                std::
                vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                ::
                emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                          ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                            *)&init_insts,
                           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           &local_3b8);
                __position = std::
                             vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                             ::erase(__range2,(const_iterator)__position._M_current);
                _Var23._M_p = local_3b8._M_dataplus._M_p;
LAB_00146e7b:
                if ((_func_int **)_Var23._M_p != (_func_int **)0x0) {
                  (**(code **)(*(_func_int **)_Var23._M_p + 0x28))();
                }
              }
            }
          }
          std::__cxx11::string::~string((string *)&name);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&val.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          var_replace::Var_Replace::~Var_Replace((Var_Replace *)&vars);
          p_Var22 = (_Base_ptr)std::_Rb_tree_increment(local_3d8);
        }
        for (; puVar7 = call_insts.
                        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
            __args_00 = call_insts.
                        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start, __args != puVar5;
            __args = __args + 1) {
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                      *)this_01,__args);
        }
        for (; __args_00 != puVar7; __args_00 = __args_00 + 1) {
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                      *)this_01,__args_00);
        }
        std::
        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ::~vector(&call_insts);
        std::
        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ::~vector(&init_insts);
      }
      std::
      _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
      ::~_Rb_tree(&ref_results._M_t);
      var_replace::Var_Replace::~Var_Replace(&vp);
    }
  }
  return;
}

Assistant:

void Func_Array_Global::optimize_func(mir::inst::MirFunction& func,
                                      mir::inst::MirPackage& mir) {
  if (!func.basic_blks.size() || func.name == "$$5_main") {
    return;
  }
  auto& startBlk = func.basic_blks.begin()->second;
  var_replace::Var_Replace vp(func);
  std::set<mir::inst::VarId> ref_results;
  for (auto& inst : startBlk.inst) {
    if (inst->inst_kind() == mir::inst::InstKind::Ref &&
        inst->useVars().size()) {
      ref_results.insert(inst->dest);
    }
  }
  for (auto& inst : startBlk.inst) {
    if (inst->inst_kind() == mir::inst::InstKind::Store) {
      auto vars = inst->useVars();
      if (vars.size() > 1) {  // store must be all const(except addr)
        for (auto var : vars) {
          if (ref_results.count(var)) {
            ref_results.erase(var);
          }
        }
      }
    } else if (inst->inst_kind() == mir::inst::InstKind::Call) {
      auto& i = *inst;
      auto call = dynamic_cast<mir::inst::CallInst*>(&i);
      if (call->func == "memset") {
        continue;
      }
      auto vars = inst->useVars();
      if (vars.size() > 1) {  // store must be all const(except addr)
        for (auto var : vars) {
          if (ref_results.count(var)) {
            ref_results.erase(var);
          }
        }
      }
    }
  }

  for (auto& blk : func.basic_blks) {
    if (blk.first == startBlk.id) {
      continue;
    }
    for (auto& inst : blk.second.inst) {
      if (inst->inst_kind() == mir::inst::InstKind::Store ||
          inst->inst_kind() == mir::inst::InstKind::Call) {
        for (auto var : ref_results) {
          if (inst->useVars().count(var)) {
            ref_results.erase(var);
            break;
          }
        }
      }
    }
  }

  if (ref_results.size()) {
    GlobalVarManager gvm(mir);
    std::vector<std::unique_ptr<mir::inst::Inst>> init_insts;
    std::vector<std::unique_ptr<mir::inst::Inst>> call_insts;
    bool after_call = false;
    auto& init_func = gvm.get_init_func();
    auto& init_blk = init_func.basic_blks.begin()->second;
    for (auto& inst : init_blk.inst) {
      if (inst->inst_kind() == mir::inst::InstKind::Call) {
        after_call = true;
      }
      if (after_call) {
        call_insts.push_back(std::move(inst));
      } else {
        init_insts.push_back(std::move(inst));
      }
    }
    init_blk.inst.clear();
    for (auto var : ref_results) {
      var_replace::Var_Replace vp(func);
      auto def_point = vp.defpoint.at(var);
      auto& inst =
          func.basic_blks.at(def_point.first).inst.at(def_point.second);
      auto ref_var = *inst->useVars().begin();
      std::vector<uint32_t> val(func.variables.at(ref_var.id).size() / 4, 0);
      auto name = gvm.add_global_var(func.name, ref_var, val);
      LOG(TRACE) << "convert array " << ref_var << "in " << func.name
                 << " to global array " << name << "" << std::endl;
      inst = std::make_unique<mir::inst::RefInst>(var, name);
      auto init_var = gvm.get_new_init_id(func.variables.at(var.id));
      init_insts.push_back(
          std::make_unique<mir::inst::RefInst>(init_var, name));
      func.variables.erase(ref_var);

      for (auto iter = startBlk.inst.begin(); iter != startBlk.inst.end();) {
        auto& inst = *iter;
        if (inst->useVars().count(var) &&
            inst->inst_kind() == mir::inst::InstKind::Store) {
          auto ptr = std::unique_ptr<mir::inst::Inst>(inst->deep_copy());
          ptr->replace(var, init_var);
          init_insts.push_back(std::move(ptr));
          iter = startBlk.inst.erase(iter);
        } else if (inst->useVars().count(var) &&
                   inst->inst_kind() == mir::inst::InstKind::Call) {
          auto& inst = *iter;
          auto& i = *inst;
          auto callInst = dynamic_cast<mir::inst::CallInst*>(&i);
          if (callInst->func == "memset") {
            auto ptr = std::unique_ptr<mir::inst::Inst>(inst->deep_copy());
            ptr->replace(var, init_var);
            ptr->dest = gvm.get_new_init_id(func.variables.at(inst->dest.id));
            init_insts.push_back(std::move(ptr));
            iter = startBlk.inst.erase(iter);
          }
        } else {
          iter++;
        }
      }
    }

    for (auto& inst : init_insts) {
      init_blk.inst.push_back(std::move(inst));
    }

    for (auto& inst : call_insts) {
      init_blk.inst.push_back(std::move(inst));
    }
  }
}